

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen7Texture.cpp
# Opt level: O1

GMM_STATUS __thiscall
GmmLib::GmmGen7TextureCalc::FillTex3D
          (GmmGen7TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,__GMM_BUFFER_TYPE *pRestrictions)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint32_t uVar4;
  anon_struct_8_45_9b07292e_for_Gpu aVar5;
  __GMM_BUFFER_TYPE *pBufferType;
  GmmTextureCalc *this_00;
  GMM_TEXTURE_INFO *pTexInfo_00;
  uint8_t uVar6;
  uint uVar7;
  uint32_t uVar8;
  int iVar9;
  GMM_STATUS GVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint32_t local_68;
  uint32_t local_64;
  uint32_t CompressHeight;
  uint32_t CompressDepth;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  GmmTextureCalc *local_48;
  uint local_3c;
  GMM_TEXTURE_INFO *pGStack_38;
  uint32_t CompressWidth;
  
  GVar10 = GMM_ERROR;
  if (pRestrictions != (__GMM_BUFFER_TYPE *)0x0 && pTexInfo != (GMM_TEXTURE_INFO *)0x0) {
    _CompressHeight = pRestrictions;
    local_58 = GmmGetPlatformInfo((this->super_GmmTextureCalc).pGmmLibContext);
    uVar8 = pTexInfo->BitsPerPixel;
    uVar15 = (uint)pTexInfo->BaseWidth;
    uVar3 = pTexInfo->Depth;
    uVar4 = (pTexInfo->Alignment).HAlign;
    local_48 = &this->super_GmmTextureCalc;
    pGStack_38 = pTexInfo;
    uVar6 = GmmIsCompressed((this->super_GmmTextureCalc).pGmmLibContext,pTexInfo->Format);
    GmmTextureCalc::GetCompressionBlockDimensions
              (local_48,pGStack_38->Format,&local_3c,&local_68,&local_64);
    pTexInfo_00 = pGStack_38;
    this_00 = local_48;
    pBufferType = _CompressHeight;
    aVar5 = (pGStack_38->Flags).Gpu;
    uVar7 = (uVar4 - 1) + uVar15;
    uVar11 = 0;
    uVar12 = 0;
    do {
      uVar7 = uVar7 & -uVar4;
      if (uVar6 == '\0') {
        if ((aVar5._0_4_ >> 0x1d & 1) == 0) {
          if (((ulong)aVar5 & 2) != 0) {
            if (((ulong)aVar5 >> 0x29 & 1) == 0) {
              if (((ulong)aVar5 >> 0x28 & 1) != 0) {
                if (uVar8 == 0x80) {
LAB_001b1293:
                  uVar7 = uVar7 >> 2;
                }
                else if (uVar8 == 0x40) {
LAB_001b128e:
                  uVar7 = uVar7 >> 3;
                }
                else if (uVar8 == 0x20) {
                  uVar7 = uVar7 >> 4;
                }
              }
            }
            else if (uVar8 == 0x80) {
              uVar7 = uVar7 >> 1;
            }
            else {
              if (uVar8 == 0x40) goto LAB_001b1293;
              if (uVar8 == 0x20) goto LAB_001b128e;
            }
          }
        }
        else {
          uVar7 = uVar7 * 2;
        }
      }
      else {
        uVar7 = uVar7 / local_3c;
      }
      uVar13 = uVar3 >> ((byte)uVar11 & 0x1f);
      uVar13 = uVar13 + (uVar13 == 0);
      uVar14 = (uint)(1L << ((byte)uVar11 & 0x3f));
      if (uVar14 <= uVar13) {
        uVar13 = uVar14;
      }
      uVar7 = uVar13 * uVar8 * uVar7 >> 3;
      if (uVar7 < uVar12) {
        uVar7 = uVar12;
      }
      uVar12 = uVar7;
      uVar15 = (uVar15 >> 1) + (uint)(uVar15 >> 1 == 0);
      uVar7 = uVar15 + (uVar4 - 1);
      uVar11 = uVar11 + 1;
    } while (pGStack_38->MaxLod + 1 + (uint)(pGStack_38->MaxLod == 0xffffffff) != uVar11);
    uVar7 = _CompressHeight->MinPitch;
    if (_CompressHeight->MinPitch < uVar12) {
      uVar7 = uVar12;
    }
    uVar7 = -_CompressHeight->PitchAlignment & (_CompressHeight->PitchAlignment - 1) + uVar7;
    uVar8 = GetTotal3DHeight((GmmGen7TextureCalc *)local_48,pGStack_38);
    if (local_58->TileInfo[pTexInfo_00->TileMode].LogicalSize != 0) {
      uVar1 = local_58->TileInfo[pTexInfo_00->TileMode].LogicalTileWidth;
      uVar2 = local_58->TileInfo[pTexInfo_00->TileMode].LogicalTileHeight;
      uVar7 = uVar7 + uVar1 + -1 & -uVar1;
      uVar8 = uVar8 + uVar2 + -1 & -uVar2;
    }
    uStack_50 = 0;
    uStack_4c = 0;
    local_58._0_4_ = uVar7;
    local_58._4_4_ = uVar8;
    uVar6 = GmmIsYUVPacked(pTexInfo_00->Format);
    if (((uVar6 != '\0') || (pTexInfo_00->BitsPerPixel == 0x60)) ||
       (uVar8 = local_58._4_4_, pTexInfo_00->BitsPerPixel == 0x30)) {
      if ((uint)local_58 == 0) {
        iVar9 = 0x11;
      }
      else {
        iVar9 = ((uint)local_58 + 0xf) / (uint)local_58 + 1;
      }
      uVar8 = local_58._4_4_ + iVar9;
    }
    GVar10 = GmmTextureCalc::FillTexPitchAndSize
                       (this_00,pTexInfo_00,(ulong)(uint)local_58,uVar8 + 1 & 0xfffffffe,pBufferType
                       );
    if (GVar10 == GMM_SUCCESS) {
      Fill3DTexOffsetAddress((GmmGen7TextureCalc *)this_00,pTexInfo_00);
    }
  }
  return GVar10;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmGen7TextureCalc::FillTex3D(GMM_TEXTURE_INFO * pTexInfo,
                                                             __GMM_BUFFER_TYPE *pRestrictions)
{
    uint32_t   AlignedMipWidth;
    uint32_t   BitsPerPixel;
    uint32_t   Depth, Height, Width;
    uint32_t   i, MipsInThisRow, MipWidth;
    uint32_t   RenderPitch = 0, ThisRowPitch;
    uint32_t   UnitAlignWidth;
    uint32_t   Total3DHeight;
    uint32_t   WidthBytesPhysical;
    uint8_t    Compress;
    uint32_t   CompressHeight, CompressWidth, CompressDepth;
    bool       SeparateStencil;
    GMM_STATUS Status;

    GMM_DPF_ENTER;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pRestrictions, GMM_ERROR);

    const __GMM_PLATFORM_RESOURCE *pPlatformResource = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    BitsPerPixel = pTexInfo->BitsPerPixel;
    Height       = pTexInfo->BaseHeight;
    Width        = GFX_ULONG_CAST(pTexInfo->BaseWidth);
    Depth        = pTexInfo->Depth;

    // Align before we compress
    UnitAlignWidth = pTexInfo->Alignment.HAlign;
    Compress       = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);
    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);
    SeparateStencil = pTexInfo->Flags.Gpu.SeparateStencil ? true : false;

    // Unaligned MipMap dimension variables
    MipWidth = Width;

    // Aligned MipMap dimension variables
    AlignedMipWidth = GFX_ALIGN(MipWidth, UnitAlignWidth);

    // Calculate the render pitch exactly the same way we do the
    // offset for each Mip level
    for(i = 0; i <= pTexInfo->MaxLod; i++)
    {
        if(Compress)
        {
            // If there is compression, compress after the alignment at each level
            AlignedMipWidth /= CompressWidth;
        }
        else if(SeparateStencil)
        {
            AlignedMipWidth *= 2;
        }
        else if(pTexInfo->Flags.Gpu.CCS)
        {
            if(pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
            {
                switch(BitsPerPixel)
                {
                    case 32:
                        AlignedMipWidth /= 8;
                        break;
                    case 64:
                        AlignedMipWidth /= 4;
                        break;
                    case 128:
                        AlignedMipWidth /= 2;
                        break;
                    default:
                        __GMM_ASSERT(0);
                }
            }
            else if(pTexInfo->Flags.Gpu.__NonMsaaTileXCcs)
            {
                switch(BitsPerPixel)
                {
                    case 32:
                        AlignedMipWidth /= 16;
                        break;
                    case 64:
                        AlignedMipWidth /= 8;
                        break;
                    case 128:
                        AlignedMipWidth /= 4;
                        break;
                    default:
                        __GMM_ASSERT(0);
                }
            }
        }

        // See how many mip can fit in one row
        MipsInThisRow = GFX_2_TO_POWER_OF(i);

        // LOD planes may be less than MipsInThisRow, take the smaller value for pitch
        MipsInThisRow = GFX_MIN(GFX_MAX(1, (Depth >> i)), MipsInThisRow);
        ThisRowPitch  = AlignedMipWidth * MipsInThisRow;

        // Default pitch
        WidthBytesPhysical = ThisRowPitch * BitsPerPixel >> 3;

        if(RenderPitch < WidthBytesPhysical)
        {
            RenderPitch = WidthBytesPhysical;
        }

        MipWidth >>= 1;
        // Clamp such that mip width is at least 1
        MipWidth        = GFX_MAX(MipWidth, 1);
        AlignedMipWidth = GFX_ALIGN(MipWidth, UnitAlignWidth);
    }

    WidthBytesPhysical = RenderPitch;

    // Make sure the pitch satisfy linear min pitch requirment
    WidthBytesPhysical = GFX_MAX(WidthBytesPhysical,
                                 pRestrictions->MinPitch);

    // Make sure pitch satisfy alignment restriction
    WidthBytesPhysical = GFX_ALIGN(WidthBytesPhysical,
                                   pRestrictions->PitchAlignment);

    // Get Total height for the entire 3D texture
    Total3DHeight = GetTotal3DHeight(pTexInfo);

    if(GMM_IS_TILED(pPlatformResource->TileInfo[pTexInfo->TileMode]))
    {
        // Align to tile boundary
        Total3DHeight = GFX_ALIGN(Total3DHeight,
                                  pPlatformResource->TileInfo[pTexInfo->TileMode].LogicalTileHeight);
        WidthBytesPhysical = GFX_ALIGN(WidthBytesPhysical,
                                       pPlatformResource->TileInfo[pTexInfo->TileMode].LogicalTileWidth);
    }

    // If a texture is YUV packed, 96, or 48 bpp then one row plus 16 bytes of
    // padding needs to be added. Since this will create a none pitch aligned
    // surface the padding is aligned to the next row
    if(GmmIsYUVPacked(pTexInfo->Format) ||
       (pTexInfo->BitsPerPixel == GMM_BITS(96)) ||
       (pTexInfo->BitsPerPixel == GMM_BITS(48)))
    {
        Total3DHeight += GMM_SCANLINES(1) + GFX_CEIL_DIV(GMM_BYTES(16), WidthBytesPhysical);
    }

    Total3DHeight = GFX_ALIGN(Total3DHeight, __GMM_EVEN_ROW);

    if((Status = // <-- Note assignment.
        FillTexPitchAndSize(
        pTexInfo, WidthBytesPhysical, Total3DHeight, pRestrictions)) == GMM_SUCCESS)
    {
        Fill3DTexOffsetAddress(pTexInfo);
    }

    GMM_DPF_EXIT;
    return (Status);
}